

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V3f __thiscall Imf_3_4::LatLongMap::direction(LatLongMap *this,Box2i *dataWindow,V2f *pixelPosition)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  V3f VVar6;
  V2f ll;
  float local_18;
  float local_14;
  
  latLong(dataWindow,pixelPosition);
  fVar1 = sinf(local_14);
  fVar2 = cosf(local_18);
  fVar3 = sinf(local_18);
  fVar4 = cosf(local_14);
  fVar5 = cosf(local_18);
  VVar6.x = fVar5 * fVar4;
  VVar6.y = (float)extraout_XMM0_Db;
  *(float *)this = fVar2 * fVar1;
  *(float *)(this + 4) = fVar3;
  *(float *)(this + 8) = VVar6.x;
  VVar6.z = fVar3;
  return VVar6;
}

Assistant:

V3f
direction (const Box2i& dataWindow, const V2f& pixelPosition)
{
    V2f ll = latLong (dataWindow, pixelPosition);

    return V3f (sin (ll.y) * cos (ll.x), sin (ll.x), cos (ll.y) * cos (ll.x));
}